

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  FatalConditionHandler fatalConditionHandler;
  FatalConditionHandler *in_stack_ffffffffffffffe0;
  
  FatalConditionHandler::FatalConditionHandler(in_stack_ffffffffffffffe0);
  TestCase::invoke((TestCase *)0x1c2309);
  FatalConditionHandler::reset(in_stack_ffffffffffffffe0);
  FatalConditionHandler::~FatalConditionHandler((FatalConditionHandler *)0x1c2321);
  return;
}

Assistant:

void invokeActiveTestCase() {
            FatalConditionHandler fatalConditionHandler; // Handle signals
            m_activeTestCase->invoke();
            fatalConditionHandler.reset();
        }